

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O1

int __thiscall
QGIFFormat::decode(QGIFFormat *this,QImage *image,uchar *buffer,int length,int *nextFrameDelay,
                  int *loopCount)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  short *psVar5;
  bool bVar6;
  QSize QVar7;
  short *psVar8;
  undefined1 auVar9 [16];
  byte bVar10;
  char cVar11;
  uint uVar12;
  int iVar13;
  State SVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  short *psVar18;
  size_t sVar19;
  QRgb *pQVar20;
  ulong uVar21;
  void *pvVar22;
  int iVar23;
  uchar *puVar24;
  long lVar25;
  ulong uVar26;
  QRgb **ppQVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  undefined1 auVar37 [16];
  long lVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uchar *local_90;
  long local_88;
  long lVar33;
  
  if (this->stack == (short *)0x0) {
    psVar18 = (short *)operator_new__(0x8000);
    this->stack = psVar18;
    this->table[0] = psVar18 + 0x2000;
    this->table[1] = psVar18 + 0x3000;
  }
  QImage::detach();
  local_88 = QImage::bytesPerLine();
  local_90 = (uchar *)QImage::bits();
  this->digress = false;
  iVar31 = length;
  do {
    if ((this->digress != false) || (iVar31 == 0)) {
      return length - iVar31;
    }
    if (Error < this->state) goto LAB_0010393d;
    bVar10 = *buffer;
    uVar12 = (uint)bVar10;
    bVar6 = false;
    switch(this->state) {
    case Header:
      iVar13 = this->count;
      this->count = iVar13 + 1;
      this->hold[iVar13] = bVar10;
      if (this->count == 6) {
        this->gif89 = this->hold[4] != '7' || this->hold[3] != '8';
        this->state = LogicalScreenDescriptor;
        goto LAB_00103936;
      }
      break;
    case LogicalScreenDescriptor:
      iVar13 = this->count;
      this->count = iVar13 + 1;
      this->hold[iVar13] = bVar10;
      if (this->count == 7) {
        this->swidth = (uint)*(ushort *)this->hold;
        this->sheight = (uint)*(ushort *)(this->hold + 2);
        bVar10 = this->hold[4];
        uVar15 = 2 << (bVar10 & 7);
        this->gcmap = (bool)-((char)bVar10 >> 7);
        this->gncols = uVar15;
        uVar12 = (uint)this->hold[5];
        if (-1 < (char)bVar10) {
          uVar12 = 0xffffffff;
        }
        this->bgcol = uVar12;
        this->trans_index = -1;
        this->count = 0;
        this->ncols = uVar15;
        if ((bool)-((char)bVar10 >> 7) != true) goto LAB_00103755;
        this->ccount = 0;
        this->state = GlobalColorMap;
        pQVar20 = (QRgb *)operator_new__(8L << (bVar10 & 7) | 4);
        this->globalcmap = pQVar20;
        pQVar20[uVar15] = 0xffffff;
      }
      break;
    default:
      iVar13 = this->count;
      this->count = iVar13 + 1;
      this->hold[iVar13] = bVar10;
      if (this->count == 3) {
        SVar14 = this->state;
        if (SVar14 == LocalColorMap) {
          iVar13 = this->ccount;
          ppQVar27 = &this->localcmap;
          if (iVar13 < this->lncols) goto LAB_001038fe;
        }
        else {
          iVar13 = this->ccount;
          ppQVar27 = &this->globalcmap;
LAB_001038fe:
          (*ppQVar27)[iVar13] =
               (uint)this->hold[1] << 8 | *(int *)this->hold << 0x10 | (uint)this->hold[2] |
               0xff000000;
        }
        iVar13 = this->ccount + 1;
        this->ccount = iVar13;
        if (this->ncols <= iVar13) {
          SVar14 = (uint)(SVar14 == LocalColorMap) * 2 + Introducer;
          goto LAB_00103933;
        }
        goto LAB_00103936;
      }
      break;
    case Introducer:
      iVar13 = this->count;
      this->count = iVar13 + 1;
      this->hold[iVar13] = bVar10;
      if (uVar12 == 0x21) {
        this->state = ExtensionLabel;
      }
      else if (uVar12 == 0x3b) {
        this->state = Done;
      }
      else if (uVar12 == 0x2c) {
        this->state = ImageDescriptor;
      }
      else {
        this->digress = true;
        this->state = Error;
      }
      break;
    case ImageDescriptor:
      iVar13 = this->count;
      this->count = iVar13 + 1;
      this->hold[iVar13] = bVar10;
      if (this->count == 10) {
        uVar15 = (uint)*(ushort *)(this->hold + 5);
        uVar12 = uVar15;
        if (this->hold[6] < 0x40) {
          uVar12 = 0x4000;
        }
        if ((int)uVar12 < this->swidth / 10) {
          this->swidth = -1;
        }
        uVar29 = (uint)*(ushort *)(this->hold + 7);
        uVar12 = uVar29;
        if (this->hold[8] < 0x40) {
          uVar12 = 0x4000;
        }
        if ((int)uVar12 < this->sheight / 10) {
          this->sheight = -1;
        }
        uVar2 = *(ushort *)(this->hold + 1);
        if (this->swidth < 1) {
          this->swidth = uVar15 + uVar2;
        }
        uVar3 = *(ushort *)(this->hold + 3);
        if (this->sheight < 1) {
          this->sheight = uVar3 + uVar29;
        }
        uVar12 = this->trans_index;
        cVar11 = QImage::isNull();
        if (cVar11 == '\0') {
LAB_00103e11:
          cVar11 = QImage::isNull();
          if (cVar11 != '\0') goto LAB_00103e22;
          disposePrevious(this,image);
          this->disposed = false;
          this->left = (uint)uVar2;
          this->top = (uint)uVar3;
          this->width = uVar15;
          this->height = uVar29;
          iVar13 = uVar15 + uVar2;
          if (this->swidth <= iVar13) {
            iVar13 = this->swidth;
          }
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          this->right = iVar13 + -1;
          iVar13 = uVar29 + uVar3;
          if (this->sheight <= iVar13) {
            iVar13 = this->sheight;
          }
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          this->bottom = iVar13 + -1;
          bVar10 = this->hold[9];
          bVar6 = (bool)-((char)bVar10 >> 7);
          this->lcmap = bVar6;
          this->interlace = bVar10 >> 6 & 1;
          iVar13 = 2 << (bVar10 & 7);
          if (bVar6 == false) {
            iVar13 = 0;
          }
          this->lncols = iVar13;
          if (bVar6 == true) {
            if (this->localcmap != (QRgb *)0x0) {
              operator_delete__(this->localcmap);
            }
            iVar13 = this->lncols;
            lVar28 = (long)iVar13;
            uVar26 = lVar28 * 4 + 4;
            if (lVar28 < -1) {
              uVar26 = 0xffffffffffffffff;
            }
            pQVar20 = (QRgb *)operator_new__(uVar26);
            this->localcmap = pQVar20;
            pQVar20[lVar28] = 0xffffff;
            this->ncols = iVar13;
          }
          else {
            this->ncols = this->gncols;
          }
          piVar1 = &this->frame;
          *piVar1 = *piVar1 + 1;
          if ((*piVar1 == 0) &&
             (((this->top != 0 || this->left != 0 || (this->width < this->swidth)) ||
              (this->height < this->sheight)))) {
            uVar12 = this->trans_index;
            if ((int)uVar12 < 0) {
              uVar15 = this->bgcol;
              if (-1 < (int)uVar15) {
                uVar29 = 0xffffff;
                if ((int)(uVar15 & 0xff) <= this->ncols) {
                  if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                    uVar17 = 0;
                  }
                  else {
                    uVar17 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                      (ulong)(uVar15 & 0xff) * 4);
                  }
                  uVar29 = uVar17 & 0xffffff;
                  if (uVar12 != (uVar15 & 0xff)) {
                    uVar29 = uVar17;
                  }
                }
                uVar12 = this->swidth;
                iVar13 = this->sheight;
                if (0 < iVar13 && 0 < (int)uVar12) {
                  lVar28 = (ulong)uVar12 - 1;
                  auVar41._8_4_ = (int)lVar28;
                  auVar41._0_8_ = lVar28;
                  auVar41._12_4_ = (int)((ulong)lVar28 >> 0x20);
                  iVar23 = 0;
                  do {
                    lVar28 = QImage::scanLine((int)image);
                    auVar9 = _DAT_001060a0;
                    auVar40 = _DAT_00106090;
                    lVar25 = 0;
                    auVar37 = _DAT_00106080;
                    auVar35 = _DAT_00106070;
                    do {
                      iVar36 = SUB164(auVar41 ^ auVar40,0);
                      bVar6 = iVar36 < SUB164(auVar37 ^ auVar40,0);
                      iVar30 = SUB164(auVar41 ^ auVar40,4);
                      iVar16 = SUB164(auVar37 ^ auVar40,4);
                      if ((bool)(~(iVar30 < iVar16 || iVar16 == iVar30 && bVar6) & 1)) {
                        *(uint *)(lVar28 + lVar25) = uVar29;
                      }
                      if (iVar30 >= iVar16 && (iVar16 != iVar30 || !bVar6)) {
                        *(uint *)(lVar28 + 4 + lVar25) = uVar29;
                      }
                      iVar16 = SUB164(auVar35 ^ auVar40,4);
                      if (iVar16 <= iVar30 &&
                          (iVar16 != iVar30 || SUB164(auVar35 ^ auVar40,0) <= iVar36)) {
                        *(uint *)(lVar28 + 8 + lVar25) = uVar29;
                        *(uint *)(lVar28 + 0xc + lVar25) = uVar29;
                      }
                      lVar33 = auVar37._8_8_;
                      lVar38 = auVar9._0_8_;
                      auVar37._0_8_ = auVar37._0_8_ + lVar38;
                      lVar39 = auVar9._8_8_;
                      auVar37._8_8_ = lVar33 + lVar39;
                      lVar33 = auVar35._8_8_;
                      auVar35._0_8_ = auVar35._0_8_ + lVar38;
                      auVar35._8_8_ = lVar33 + lVar39;
                      lVar25 = lVar25 + 0x10;
                    } while ((ulong)(uVar12 + 3 >> 2) << 4 != lVar25);
                    iVar23 = iVar23 + 1;
                  } while (iVar23 != iVar13);
                }
              }
            }
            else {
              uVar15 = 0xffffff;
              if ((int)(uVar12 & 0xff) <= this->ncols) {
                if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                  uVar29 = 0;
                }
                else {
                  uVar29 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                    (ulong)(uVar12 & 0xff) * 4);
                }
                uVar15 = uVar29 & 0xffffff;
                if (0xff < uVar12) {
                  uVar15 = uVar29;
                }
              }
              uVar12 = this->swidth;
              iVar13 = this->sheight;
              if (0 < iVar13 && 0 < (int)uVar12) {
                lVar28 = (ulong)uVar12 - 1;
                auVar40._8_4_ = (int)lVar28;
                auVar40._0_8_ = lVar28;
                auVar40._12_4_ = (int)((ulong)lVar28 >> 0x20);
                iVar23 = 0;
                auVar40 = auVar40 ^ _DAT_00106090;
                do {
                  lVar28 = QImage::scanLine((int)image);
                  auVar9 = _DAT_001060a0;
                  auVar41 = _DAT_00106090;
                  lVar25 = 0;
                  auVar32 = _DAT_00106080;
                  auVar34 = _DAT_00106070;
                  do {
                    auVar37 = auVar32 ^ auVar41;
                    iVar36 = auVar40._4_4_;
                    if ((bool)(~(auVar37._4_4_ == iVar36 && auVar40._0_4_ < auVar37._0_4_ ||
                                iVar36 < auVar37._4_4_) & 1)) {
                      *(uint *)(lVar28 + lVar25) = uVar15;
                    }
                    if ((auVar37._12_4_ != auVar40._12_4_ || auVar37._8_4_ <= auVar40._8_4_) &&
                        auVar37._12_4_ <= auVar40._12_4_) {
                      *(uint *)(lVar28 + 4 + lVar25) = uVar15;
                    }
                    auVar37 = auVar34 ^ auVar41;
                    iVar30 = auVar37._4_4_;
                    if (iVar30 <= iVar36 && (iVar30 != iVar36 || auVar37._0_4_ <= auVar40._0_4_)) {
                      *(uint *)(lVar28 + 8 + lVar25) = uVar15;
                      *(uint *)(lVar28 + 0xc + lVar25) = uVar15;
                    }
                    lVar33 = auVar32._8_8_;
                    lVar38 = auVar9._0_8_;
                    auVar32._0_8_ = auVar32._0_8_ + lVar38;
                    lVar39 = auVar9._8_8_;
                    auVar32._8_8_ = lVar33 + lVar39;
                    lVar33 = auVar34._8_8_;
                    auVar34._0_8_ = auVar34._0_8_ + lVar38;
                    auVar34._8_8_ = lVar33 + lVar39;
                    lVar25 = lVar25 + 0x10;
                  } while ((ulong)(uVar12 + 3 >> 2) << 4 != lVar25);
                  iVar23 = iVar23 + 1;
                } while (iVar23 != iVar13);
              }
            }
          }
          if (this->disposal == RestoreImage) {
            iVar23 = this->swidth + -1;
            iVar13 = this->left;
            if (iVar23 < this->left) {
              iVar13 = iVar23;
            }
            if (this->right <= iVar23) {
              iVar23 = this->right;
            }
            iVar30 = this->sheight + -1;
            iVar36 = this->top;
            if (iVar30 < this->top) {
              iVar36 = iVar30;
            }
            if (this->bottom <= iVar30) {
              iVar30 = this->bottom;
            }
            uVar15 = (iVar23 - iVar13) + 1;
            iVar30 = iVar30 - iVar36;
            uVar12 = iVar30 + 1;
            uVar26 = (ulong)uVar12;
            iVar16 = QImage::width();
            if ((iVar23 - iVar13 < iVar16) && (iVar23 = QImage::height(), iVar30 < iVar23)) {
LAB_0010436e:
              lVar28 = QImage::bytesPerLine();
              pvVar22 = (void *)QImage::bits();
              if (-1 < iVar30) {
                puVar24 = local_90 + iVar36 * local_88 + (long)iVar13 * 4;
                do {
                  memcpy(pvVar22,puVar24,(long)(int)uVar15 << 2);
                  puVar24 = puVar24 + local_88;
                  pvVar22 = (void *)((long)pvVar22 + lVar28);
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              goto LAB_001043d9;
            }
            if (0xfffffff < (ulong)((long)(int)uVar12 * (long)(int)uVar15)) goto LAB_00103e22;
            uVar17 = QImage::width();
            uVar29 = uVar15;
            if ((int)uVar15 < (int)uVar17) {
              uVar29 = uVar17;
            }
            uVar17 = QImage::height();
            uVar21 = (ulong)uVar17;
            if ((int)uVar17 <= (int)uVar12) {
              uVar21 = uVar26;
            }
            cVar11 = QImageIOHandler::allocateImage
                               ((QSize)((ulong)uVar29 | uVar21 << 0x20),Format_RGB32,
                                &this->backingstore);
            if (cVar11 != '\0') {
              pvVar22 = (void *)QImage::bits();
              sVar19 = QImage::sizeInBytes();
              memset(pvVar22,0,sVar19);
              goto LAB_0010436e;
            }
            this->state = Error;
            goto LAB_00103e29;
          }
LAB_001043d9:
          this->count = 0;
          SVar14 = TableImageLZWSize;
          if (this->lcmap == true) {
            this->ccount = 0;
            SVar14 = LocalColorMap;
          }
          this->state = SVar14;
          this->x = this->left;
          this->y = this->top;
          this->accum = 0;
          this->bitcount = 0;
          this->sp = this->stack;
          this->firstcode = 0;
          this->oldcode = 0;
          this->needfirst = true;
          this->out_of_bounds = this->sheight <= this->top || this->swidth <= this->left;
          bVar6 = true;
        }
        else {
          QVar7.wd.m_i = this->swidth;
          QVar7.ht.m_i = this->sheight;
          if (((ulong)((long)this->sheight * (long)this->swidth) < 0x10000000) &&
             (cVar11 = QImageIOHandler::allocateImage(QVar7,~uVar12 >> 0x1f | Format_RGB32,image),
             cVar11 != '\0')) {
            local_88 = QImage::bytesPerLine();
            local_90 = (uchar *)QImage::bits();
            if (local_90 == (uchar *)0x0) {
              local_90 = (uchar *)0x0;
            }
            else {
              sVar19 = QImage::sizeInBytes();
              memset(local_90,0,sVar19);
            }
            goto LAB_00103e11;
          }
LAB_00103e22:
          this->state = Error;
LAB_00103e29:
          bVar6 = false;
        }
        if (!bVar6) {
LAB_0010445d:
          bVar6 = false;
          goto switchD_001033e9_caseD_11;
        }
      }
      break;
    case TableImageLZWSize:
      this->lzwsize = uVar12;
      SVar14 = Error;
      if (bVar10 < 0xd) {
        lVar28 = 1L << (bVar10 & 0x3f);
        this->code_size = uVar12 + 1;
        iVar13 = (int)lVar28;
        this->clear_code = iVar13;
        this->end_code = iVar13 + 1;
        this->max_code_size = 2 << (bVar10 & 0x1f);
        this->max_code = iVar13 + 2;
        psVar18 = this->table[0];
        psVar5 = this->table[1];
        lVar25 = 0;
        do {
          psVar18[lVar25] = 0;
          psVar5[lVar25] = (short)lVar25;
          lVar25 = lVar25 + 1;
        } while (lVar28 != lVar25);
        SVar14 = ImageDataBlockSize;
      }
      this->state = SVar14;
      goto LAB_00103936;
    case ImageDataBlockSize:
      this->expectcount = uVar12;
      if (bVar10 == 0) {
        this->state = Introducer;
        this->digress = true;
        this->newFrame = true;
      }
      else {
        this->state = ImageDataBlock;
      }
      break;
    case ImageDataBlock:
      this->count = this->count + 1;
      uVar15 = this->bitcount;
      if (uVar15 != 0xffff8000) {
        if (0x1f < uVar15) {
          this->state = Error;
          goto LAB_0010445d;
        }
        this->accum = this->accum | uVar12 << ((byte)uVar15 & 0x1f);
        this->bitcount = uVar15 + 8;
      }
      while( true ) {
        iVar13 = this->code_size;
        if ((this->bitcount < iVar13) || (this->state != ImageDataBlock)) break;
        uVar12 = this->clear_code;
        uVar15 = ~(-1 << ((byte)iVar13 & 0x1f)) & this->accum;
        this->bitcount = this->bitcount - iVar13;
        this->accum = this->accum >> ((byte)iVar13 & 0x1f);
        if (uVar15 == uVar12) {
          if (this->needfirst == false) {
            this->code_size = this->lzwsize + 1;
            this->max_code_size = uVar12 * 2;
            this->max_code = uVar12 + 2;
          }
          this->needfirst = true;
        }
        else if (uVar15 == this->end_code) {
          this->bitcount = -0x8000;
        }
        else if (this->needfirst == true) {
          this->oldcode = uVar15;
          this->firstcode = uVar15;
          if (this->out_of_bounds == false) {
            iVar13 = QImage::height();
            if ((this->y < iVar13) && ((this->frame == 0 || (this->firstcode != this->trans_index)))
               ) {
              bVar10 = (byte)this->firstcode;
              uVar12 = 0xffffff;
              if ((int)(uint)bVar10 <= this->ncols) {
                if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                  uVar15 = 0;
                }
                else {
                  uVar15 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                    (ulong)bVar10 * 4);
                }
                uVar12 = uVar15 & 0xffffff;
                if (this->trans_index != (uint)bVar10) {
                  uVar12 = uVar15;
                }
              }
              *(uint *)(local_90 + (long)this->x * 4 + this->y * local_88) = uVar12;
            }
          }
          iVar13 = this->x + 1;
          this->x = iVar13;
          if (this->swidth <= iVar13) {
            this->out_of_bounds = true;
          }
          this->needfirst = false;
          iVar23 = this->left;
          if (this->width + iVar23 <= iVar13) {
            this->x = iVar23;
            this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar23;
            nextY(this,local_90,(int)local_88);
          }
        }
        else {
          this->incode = uVar15;
          iVar23 = this->max_code;
          uVar29 = uVar15;
          if (iVar23 <= (int)uVar15) {
            psVar18 = this->sp;
            this->sp = psVar18 + 1;
            *psVar18 = (short)this->firstcode;
            uVar29 = this->oldcode;
          }
          psVar18 = this->table[0];
          psVar5 = this->table[1];
          lVar28 = (long)this->sp - (long)this->stack;
          psVar8 = this->sp;
          while ((int)(uVar12 + 2) <= (int)uVar29) {
            if (iVar23 <= (int)uVar29) goto LAB_00103dc8;
            sVar4 = psVar5[(int)uVar29];
            this->sp = psVar8 + 1;
            *psVar8 = sVar4;
            if ((uVar29 == (int)psVar18[(int)uVar29]) ||
               (lVar28 = lVar28 + 2, uVar29 = (int)psVar18[(int)uVar29], psVar8 = psVar8 + 1,
               0x3ffe < lVar28)) goto LAB_00103dc8;
          }
          if ((int)uVar29 < 0) {
LAB_00103dc8:
            this->state = Error;
            bVar6 = false;
            goto switchD_001033e9_caseD_11;
          }
          psVar18 = this->table[1];
          psVar5 = this->sp;
          sVar4 = psVar18[uVar29];
          this->firstcode = (int)sVar4;
          this->sp = psVar5 + 1;
          *psVar5 = sVar4;
          if (iVar23 < 0x1000) {
            this->table[0][iVar23] = (short)this->oldcode;
            psVar18[iVar23] = sVar4;
            this->max_code = iVar23 + 1;
            iVar36 = this->max_code_size;
            if (iVar36 < 0x1000 && iVar36 <= iVar23 + 1) {
              this->max_code_size = iVar36 * 2;
              this->code_size = iVar13 + 1;
            }
          }
          this->oldcode = uVar15;
          iVar13 = QImage::height();
          if ((this->out_of_bounds == false) && (this->y < iVar13)) {
            puVar24 = local_90 + this->y * local_88;
          }
          else {
            puVar24 = (uchar *)0x0;
          }
          while (psVar18 = this->sp, this->stack < psVar18) {
            this->sp = psVar18 + -1;
            if ((this->out_of_bounds == false) && (this->y < iVar13)) {
              bVar10 = *(byte *)(psVar18 + -1);
              if ((this->frame == 0) || (this->trans_index != (uint)bVar10)) {
                uVar12 = 0xffffff;
                if ((int)(uint)(ushort)bVar10 <= this->ncols) {
                  if (*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) == 0) {
                    uVar15 = 0;
                  }
                  else {
                    uVar15 = *(uint *)(*(long *)(this->hold + (ulong)this->lcmap * 8 + -0x28) +
                                      (ulong)bVar10 * 4);
                  }
                  uVar12 = uVar15 & 0xffffff;
                  if (this->trans_index != (uint)(ushort)bVar10) {
                    uVar12 = uVar15;
                  }
                }
                *(uint *)(puVar24 + (long)this->x * 4) = uVar12;
              }
            }
            iVar23 = this->x + 1;
            this->x = iVar23;
            if (this->swidth <= iVar23) {
              this->out_of_bounds = true;
            }
            iVar36 = this->left;
            if (this->width + iVar36 <= iVar23) {
              this->x = iVar36;
              this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar36;
              nextY(this,local_90,(int)local_88);
              if ((this->out_of_bounds == false) && (this->y < iVar13)) {
                puVar24 = local_90 + this->y * local_88;
              }
            }
          }
        }
      }
      this->partialNewFrame = true;
      if (this->count == this->expectcount) {
        this->count = 0;
        this->state = ImageDataBlockSize;
      }
      break;
    case ExtensionLabel:
      SVar14 = (uint)(bVar10 != 0xff) * 3 + ApplicationExtension;
      if (bVar10 == 0xf9) {
        SVar14 = GraphicControlExtension;
      }
LAB_00103933:
      this->state = SVar14;
LAB_00103936:
      this->count = 0;
      break;
    case GraphicControlExtension:
      if ((long)this->count < 5) {
        this->hold[this->count] = bVar10;
      }
      uVar12 = this->count;
      this->count = uVar12 + 1;
      if (uVar12 == this->hold[0]) {
        disposePrevious(this,image);
        bVar10 = this->hold[1] >> 2 & 7;
        if (3 < bVar10) {
          bVar10 = 0;
        }
        this->disposal = (uint)bVar10;
        uVar12 = (uint)*(ushort *)(this->hold + 2);
        if (this->count < 4) {
          uVar12 = 1;
        }
        iVar13 = uVar12 * 10;
        if (uVar12 < 2) {
          iVar13 = 100;
        }
        *nextFrameDelay = iVar13;
        this->trans_index = -(uint)((this->hold[1] & 1) == 0) | (uint)this->hold[4];
        this->count = 0;
LAB_00103514:
        this->state = SkipBlockSize;
      }
      break;
    case ApplicationExtension:
      if ((long)this->count < 0xb) {
        this->hold[this->count] = bVar10;
      }
      uVar12 = this->count;
      this->count = uVar12 + 1;
      if (uVar12 == this->hold[0]) {
        SVar14 = (uint)(*(long *)(this->hold + 1) != 0x455041435354454e) * 2 +
                 NetscapeExtensionBlockSize;
        goto LAB_00103933;
      }
      break;
    case NetscapeExtensionBlockSize:
      this->expectcount = uVar12;
      this->count = 0;
      if (bVar10 == 0) {
LAB_00103755:
        this->state = Introducer;
      }
      else {
        this->state = NetscapeExtensionBlock;
      }
      break;
    case NetscapeExtensionBlock:
      if ((long)this->count < 3) {
        this->hold[this->count] = bVar10;
      }
      iVar13 = this->count + 1;
      this->count = iVar13;
      if (iVar13 == this->expectcount) {
        *loopCount = (uint)*(ushort *)(this->hold + 1);
        goto LAB_00103514;
      }
      break;
    case SkipBlockSize:
      this->expectcount = uVar12;
      this->count = 0;
      if (bVar10 == 0) goto LAB_00103755;
      this->state = SkipBlock;
      break;
    case SkipBlock:
      iVar13 = this->count + 1;
      this->count = iVar13;
      if (iVar13 == this->expectcount) goto LAB_00103514;
      break;
    case Done:
      this->digress = true;
      break;
    case Error:
      goto switchD_001033e9_caseD_11;
    }
LAB_0010393d:
    bVar6 = true;
switchD_001033e9_caseD_11:
    buffer = buffer + 1;
    iVar31 = iVar31 + -1;
    if (!bVar6) {
      return -1;
    }
  } while( true );
}

Assistant:

int QGIFFormat::decode(QImage *image, const uchar *buffer, int length,
                       int *nextFrameDelay, int *loopCount)
{
    // We are required to state that
    //    "The Graphics Interchange Format(c) is the Copyright property of
    //    CompuServe Incorporated. GIF(sm) is a Service Mark property of
    //    CompuServe Incorporated."

    if (!stack) {
        stack = new short[(1 << max_lzw_bits) * 4];
        table[0] = &stack[(1 << max_lzw_bits) * 2];
        table[1] = &stack[(1 << max_lzw_bits) * 3];
    }

    image->detach();
    qsizetype bpl = image->bytesPerLine();
    unsigned char *bits = image->bits();

#define LM(l, m) (((m)<<8)|l)
    digress = false;
    const int initial = length;
    while (!digress && length) {
        length--;
        unsigned char ch=*buffer++;
        switch (state) {
          case Header:
            hold[count++]=ch;
            if (count==6) {
                // Header
                gif89=(hold[3]!='8' || hold[4]!='7');
                state=LogicalScreenDescriptor;
                count=0;
            }
            break;
          case LogicalScreenDescriptor:
            hold[count++]=ch;
            if (count==7) {
                // Logical Screen Descriptor
                swidth=LM(hold[0], hold[1]);
                sheight=LM(hold[2], hold[3]);
                gcmap=!!(hold[4]&0x80);
                //UNUSED: bpchan=(((hold[4]&0x70)>>3)+1);
                //UNUSED: gcmsortflag=!!(hold[4]&0x08);
                gncols=2<<(hold[4]&0x7);
                bgcol=(gcmap) ? hold[5] : -1;
                //aspect=hold[6] ? double(hold[6]+15)/64.0 : 1.0;

                trans_index = -1;
                count=0;
                ncols=gncols;
                if (gcmap) {
                    ccount=0;
                    state=GlobalColorMap;
                    globalcmap = new QRgb[gncols+1]; // +1 for trans_index
                    globalcmap[gncols] = Q_TRANSPARENT;
                } else {
                    state=Introducer;
                }
            }
            break;
          case GlobalColorMap: case LocalColorMap:
            hold[count++]=ch;
            if (count==3) {
                QRgb rgb = qRgb(hold[0], hold[1], hold[2]);
                if (state == LocalColorMap) {
                    if (ccount < lncols)
                        localcmap[ccount] =  rgb;
                } else {
                    globalcmap[ccount] = rgb;
                }
                if (++ccount >= ncols) {
                    if (state == LocalColorMap)
                        state=TableImageLZWSize;
                    else
                        state=Introducer;
                }
                count=0;
            }
            break;
          case Introducer:
            hold[count++]=ch;
            switch (ch) {
              case ',':
                state=ImageDescriptor;
                break;
              case '!':
                state=ExtensionLabel;
                break;
              case ';':
                  // ### Changed: QRect(0, 0, swidth, sheight)
                state=Done;
                break;
              default:
                digress=true;
                // Unexpected Introducer - ignore block
                state=Error;
            }
            break;
          case ImageDescriptor:
            hold[count++]=ch;
            if (count==10) {
                int newleft=LM(hold[1], hold[2]);
                int newtop=LM(hold[3], hold[4]);
                int newwidth=LM(hold[5], hold[6]);
                int newheight=LM(hold[7], hold[8]);

                // disbelieve ridiculous logical screen sizes,
                // unless the image frames are also large.
                if (swidth/10 > qMax(newwidth,16384))
                    swidth = -1;
                if (sheight/10 > qMax(newheight,16384))
                    sheight = -1;

                if (swidth <= 0)
                    swidth = newleft + newwidth;
                if (sheight <= 0)
                    sheight = newtop + newheight;

                QImage::Format format = trans_index >= 0 ? QImage::Format_ARGB32 : QImage::Format_RGB32;
                if (image->isNull()) {
                    if (!withinSizeLimit(swidth, sheight)) {
                        state = Error;
                        return -1;
                    }
                    if (!QImageIOHandler::allocateImage(QSize(swidth, sheight), format, image)) {
                        state = Error;
                        return -1;
                    }
                    bpl = image->bytesPerLine();
                    bits = image->bits();
                    if (bits)
                        memset(bits, 0, image->sizeInBytes());
                }

                // Check if the previous attempt to create the image failed. If it
                // did then the image is broken and we should give up.
                if (image->isNull()) {
                    state = Error;
                    return -1;
                }

                disposePrevious(image);
                disposed = false;

                left = newleft;
                top = newtop;
                width = newwidth;
                height = newheight;

                right=qMax(0, qMin(left+width, swidth)-1);
                bottom=qMax(0, qMin(top+height, sheight)-1);
                lcmap=!!(hold[9]&0x80);
                interlace=!!(hold[9]&0x40);
                //bool lcmsortflag=!!(hold[9]&0x20);
                lncols=lcmap ? (2<<(hold[9]&0x7)) : 0;
                if (lncols) {
                    if (localcmap)
                        delete [] localcmap;
                    localcmap = new QRgb[lncols+1];
                    localcmap[lncols] = Q_TRANSPARENT;
                    ncols = lncols;
                } else {
                    ncols = gncols;
                }
                frame++;
                if (frame == 0) {
                    if (left || top || width<swidth || height<sheight) {
                        // Not full-size image - erase with bg or transparent
                        if (trans_index >= 0) {
                            fillRect(image, 0, 0, swidth, sheight, color(trans_index));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        } else if (bgcol>=0) {
                            fillRect(image, 0, 0, swidth, sheight, color(bgcol));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        }
                    }
                }

                if (disposal == RestoreImage) {
                    int l = qMin(swidth-1,left);
                    int r = qMin(swidth-1,right);
                    int t = qMin(sheight-1,top);
                    int b = qMin(sheight-1,bottom);
                    int w = r-l+1;
                    int h = b-t+1;

                    if (backingstore.width() < w
                        || backingstore.height() < h) {

                        if (!withinSizeLimit(w, h)) {
                            state = Error;
                            return -1;
                        }
                        // We just use the backing store as a byte array
                        QSize bsSize(qMax(backingstore.width(), w), qMax(backingstore.height(), h));
                        if (!QImageIOHandler::allocateImage(bsSize, QImage::Format_RGB32,
                                                            &backingstore)) {
                            state = Error;
                            return -1;
                        }
                        memset(backingstore.bits(), 0, backingstore.sizeInBytes());
                    }
                    const qsizetype dest_bpl = backingstore.bytesPerLine();
                    unsigned char *dest_data = backingstore.bits();
                    for (int ln=0; ln<h; ln++) {
                        memcpy(FAST_SCAN_LINE(dest_data, dest_bpl, ln),
                               FAST_SCAN_LINE(bits, bpl, t+ln) + l*sizeof(QRgb), w*sizeof(QRgb));
                    }
                }

                count=0;
                if (lcmap) {
                    ccount=0;
                    state=LocalColorMap;
                } else {
                    state=TableImageLZWSize;
                }
                x = left;
                y = top;
                accum = 0;
                bitcount = 0;
                sp = stack;
                firstcode = oldcode = 0;
                needfirst = true;
                out_of_bounds = left>=swidth || y>=sheight;
            }
            break;
          case TableImageLZWSize: {
            lzwsize=ch;
            if (lzwsize > max_lzw_bits) {
                state=Error;
            } else {
                code_size=lzwsize+1;
                clear_code=1<<lzwsize;
                end_code=clear_code+1;
                max_code_size=2*clear_code;
                max_code=clear_code+2;
                int i;
                for (i=0; i<clear_code; i++) {
                    table[0][i]=0;
                    table[1][i]=i;
                }
                state=ImageDataBlockSize;
            }
            count=0;
            break;
          } case ImageDataBlockSize:
            expectcount=ch;
            if (expectcount) {
                state=ImageDataBlock;
            } else {
                state=Introducer;
                digress = true;
                newFrame = true;
            }
            break;
          case ImageDataBlock:
            count++;
            if (bitcount != -32768) {
                if (bitcount < 0 || bitcount > 31) {
                    state = Error;
                    return -1;
                }
                accum |= (ch << bitcount);
                bitcount += 8;
            }
            while (bitcount>=code_size && state==ImageDataBlock) {
                int code=accum&((1<<code_size)-1);
                bitcount-=code_size;
                accum>>=code_size;

                if (code==clear_code) {
                    if (!needfirst) {
                        code_size=lzwsize+1;
                        max_code_size=2*clear_code;
                        max_code=clear_code+2;
                    }
                    needfirst=true;
                } else if (code==end_code) {
                    bitcount = -32768;
                    // Left the block end arrive
                } else {
                    if (needfirst) {
                        firstcode=oldcode=code;
                        if (!out_of_bounds && image->height() > y && ((frame == 0) || (firstcode != trans_index)))
                            ((QRgb*)FAST_SCAN_LINE(bits, bpl, y))[x] = color(firstcode);
                        x++;
                        if (x>=swidth) out_of_bounds = true;
                        needfirst=false;
                        if (x>=left+width) {
                            x=left;
                            out_of_bounds = left>=swidth || y>=sheight;
                            nextY(bits, bpl);
                        }
                    } else {
                        incode=code;
                        if (code>=max_code) {
                            *sp++=firstcode;
                            code=oldcode;
                        }
                        while (code>=clear_code+2) {
                            if (code >= max_code) {
                                state = Error;
                                return -1;
                            }
                            *sp++=table[1][code];
                            if (code==table[0][code]) {
                                state=Error;
                                return -1;
                            }
                            if (sp-stack>=(1<<(max_lzw_bits))*2) {
                                state=Error;
                                return -1;
                            }
                            code=table[0][code];
                        }
                        if (code < 0) {
                            state = Error;
                            return -1;
                        }

                        *sp++=firstcode=table[1][code];
                        code=max_code;
                        if (code<(1<<max_lzw_bits)) {
                            table[0][code]=oldcode;
                            table[1][code]=firstcode;
                            max_code++;
                            if ((max_code>=max_code_size)
                             && (max_code_size<(1<<max_lzw_bits)))
                            {
                                max_code_size*=2;
                                code_size++;
                            }
                        }
                        oldcode=incode;
                        const int h = image->height();
                        QRgb *line = nullptr;
                        if (!out_of_bounds && h > y)
                            line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                        while (sp>stack) {
                            const uchar index = *(--sp);
                            if (!out_of_bounds && h > y && ((frame == 0) || (index != trans_index))) {
                                line[x] = color(index);
                            }
                            x++;
                            if (x>=swidth) out_of_bounds = true;
                            if (x>=left+width) {
                                x=left;
                                out_of_bounds = left>=swidth || y>=sheight;
                                nextY(bits, bpl);
                                if (!out_of_bounds && h > y)
                                    line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                            }
                        }
                    }
                }
            }
            partialNewFrame = true;
            if (count==expectcount) {
                count=0;
                state=ImageDataBlockSize;
            }
            break;
          case ExtensionLabel:
            switch (ch) {
            case 0xf9:
                state=GraphicControlExtension;
                break;
            case 0xff:
                state=ApplicationExtension;
                break;
#if 0
            case 0xfe:
                state=CommentExtension;
                break;
            case 0x01:
                break;
#endif
            default:
                state=SkipBlockSize;
            }
            count=0;
            break;
          case ApplicationExtension:
            if (count<11) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                if (qstrncmp((char*)(hold+1), "NETSCAPE", 8)==0) {
                    // Looping extension
                    state=NetscapeExtensionBlockSize;
                } else {
                    state=SkipBlockSize;
                }
                count=0;
            }
            break;
          case NetscapeExtensionBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=NetscapeExtensionBlock;
            else state=Introducer;
            break;
          case NetscapeExtensionBlock:
            if (count<3) hold[count]=ch;
            count++;
            if (count==expectcount) {
                *loopCount = hold[1]+hold[2]*256;
                state=SkipBlockSize; // Ignore further blocks
            }
            break;
          case GraphicControlExtension:
            if (count<5) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                disposePrevious(image);
                uint dBits = (hold[1] >> 2) & 0x7;
                disposal = (dBits <= RestoreImage) ? Disposal(dBits) : NoDisposal;
                //UNUSED: waitforuser=!!((hold[1]>>1)&0x1);
                int delay=count>3 ? LM(hold[2], hold[3]) : 1;
                // IE and mozilla use a minimum delay of 10. With the minimum delay of 10
                // we are compatible to them and avoid huge loads on the app and xserver.
                *nextFrameDelay = (delay < 2 ? 10 : delay) * 10;

                bool havetrans=hold[1]&0x1;
                trans_index = havetrans ? hold[4] : -1;

                count=0;
                state=SkipBlockSize;
            }
            break;
          case SkipBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=SkipBlock;
            else state=Introducer;
            break;
          case SkipBlock:
            count++;
            if (count==expectcount) state=SkipBlockSize;
            break;
          case Done:
            digress=true;
            /* Netscape ignores the junk, so we do too.
            length++; // Unget
            state=Error; // More calls to this is an error
            */
            break;
          case Error:
            return -1; // Called again after done.
        }
    }
    return initial-length;
}